

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStore.cpp
# Opt level: O1

void __thiscall FIX::FileStore::setSeqNum(FileStore *this)

{
  FILE *pFVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  IOException *pIVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_38;
  
  rewind((FILE *)this->m_seqNumsFile);
  pFVar1 = (FILE *)this->m_seqNumsFile;
  uVar2 = (*(this->super_MessageStore)._vptr_MessageStore[4])(this);
  uVar3 = (*(this->super_MessageStore)._vptr_MessageStore[5])(this);
  fprintf(pFVar1,"%10.10d : %10.10d",(ulong)uVar2,(ulong)uVar3);
  pFVar1 = (FILE *)this->m_seqNumsFile;
  iVar4 = ferror(pFVar1);
  if (iVar4 != 0) {
    pIVar5 = (IOException *)__cxa_allocate_exception(0x50);
    std::operator+(&bStack_38,"Unable to write to file ",&this->m_seqNumsFileName);
    IOException::IOException(pIVar5,&bStack_38);
    __cxa_throw(pIVar5,&IOException::typeinfo,FIX::Exception::~Exception);
  }
  iVar4 = fflush(pFVar1);
  if (iVar4 == 0) {
    return;
  }
  pIVar5 = (IOException *)__cxa_allocate_exception(0x50);
  std::operator+(&bStack_38,"Unable to flush file ",&this->m_seqNumsFileName);
  IOException::IOException(pIVar5,&bStack_38);
  __cxa_throw(pIVar5,&IOException::typeinfo,FIX::Exception::~Exception);
}

Assistant:

void FileStore::setSeqNum()
{
  rewind( m_seqNumsFile );
  fprintf( m_seqNumsFile, "%10.10d : %10.10d",
           getNextSenderMsgSeqNum(), getNextTargetMsgSeqNum() );
  if ( ferror( m_seqNumsFile ) )
    throw IOException( "Unable to write to file " + m_seqNumsFileName );
  if ( fflush( m_seqNumsFile ) )
    throw IOException( "Unable to flush file " + m_seqNumsFileName );
}